

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O3

uint32_t __thiscall mjs::regexp::impl::search(impl *this,wstring_view haystack)

{
  bool bVar1;
  pointer psVar2;
  wchar_t *__s;
  uint32_t uVar3;
  wcmatch match;
  match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  local_38;
  
  __s = haystack._M_str;
  local_38.
  super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_begin = (wchar_t *)0x0;
  local_38.
  super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = std::__detail::
          __regex_algo_impl<wchar_t_const*,std::allocator<std::__cxx11::sub_match<wchar_t_const*>>,wchar_t,std::__cxx11::regex_traits<wchar_t>,(std::__detail::_RegexExecutorPolicy)0,false>
                    (__s,__s + haystack._M_len,&local_38,&this->r_,0);
  uVar3 = 0xffffffff;
  if (bVar1) {
    psVar2 = local_38.
             super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)local_38.
              super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x48) {
      psVar2 = local_38.
               super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -3;
    }
    if (local_38.
        super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_38.
        super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      psVar2 = local_38.
               super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -3;
    }
    uVar3 = (uint32_t)
            ((ulong)((long)(psVar2->super_pair<const_wchar_t_*,_const_wchar_t_*>).first - (long)__s)
            >> 2);
  }
  if (local_38.
      super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return uVar3;
}

Assistant:

uint32_t search(const std::wstring_view haystack) const {
        std::wcmatch match;
        const wchar_t* const str_beg = haystack.data();
        const wchar_t* const str_end = str_beg + haystack.length();
        if (!std::regex_search(str_beg, str_end, match, r_)) {
            return npos;
        }
        return static_cast<uint32_t>(match[0].first - str_beg);
    }